

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-queue.h
# Opt level: O2

void __thiscall
kj::ProducerConsumerQueue<unsigned_long>::push
          (ProducerConsumerQueue<unsigned_long> *this,unsigned_long v)

{
  unsigned_long local_8;
  
  local_8 = v;
  if ((this->waiters).queue.head.ptr == (BaseNode *)0x0) {
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_front
              (&this->values,&local_8);
  }
  else {
    WaiterQueue<unsigned_long>::fulfill(&this->waiters,&local_8);
  }
  return;
}

Assistant:

void push(T v) {
    // Push an existing value onto the queue.

    if (!waiters.empty()) {
      // We have at least one waiter, give the value to the oldest.
      KJ_IASSERT(values.empty());

      // Fulfill the first waiter and return without store our value.
      waiters.fulfill(kj::mv(v));
    } else {
      // We don't have any waiters, store the value.
      values.push_front(kj::mv(v));
    }
  }